

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

void __thiscall
glslang::TSymbolValidater::TSymbolValidater
          (TSymbolValidater *this,TIoMapResolver *r,TInfoSink *i,TVarLiveMap **in,TVarLiveMap **out,
          TVarLiveMap **uniform,bool *hadError,EProfile profile,int version)

{
  TPoolAllocator *pTVar1;
  TVarLiveMap *pTVar2;
  bool bVar3;
  TRange TVar4;
  _Base_ptr p_Var5;
  undefined8 __s;
  char cVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  TType *type;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar11;
  _Base_ptr p_Var12;
  long lVar13;
  iterator iVar14;
  mapped_type *pmVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  TSymbolValidater *pTVar20;
  TVarLiveMap **ppTVar21;
  uint __len;
  long lVar22;
  bool diffLocation;
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> usedUniformLocation;
  TString err_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  usedUniformName;
  TString symbolName;
  TString err;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  uniformVar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  anonymousMemberMap;
  bool local_1e1;
  TSymbolValidater *local_1e0;
  TRange local_1d8;
  pool_allocator<char> local_1d0;
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> local_1c8;
  undefined1 local_1b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  aStack_198;
  long *local_188 [2];
  long local_178 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  local_168;
  TVarLiveMap **local_148;
  long local_140;
  _Rb_tree_node_base *local_138;
  value_type local_130;
  key_type local_108;
  TPoolAllocator *local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  _Rb_tree_color _Stack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  TString local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  local_60;
  
  this->resolver = r;
  this->infoSink = i;
  this->hadError = hadError;
  this->profile = profile;
  this->version = version;
  pTVar20 = this;
  for (lVar16 = 0xe; lVar16 != 0; lVar16 = lVar16 + -1) {
    pTVar20->inVarMaps[0] = *in;
    in = in + 1;
    pTVar20 = (TSymbolValidater *)(pTVar20->inVarMaps + 1);
  }
  ppTVar21 = this->outVarMaps;
  for (lVar16 = 0xe; lVar16 != 0; lVar16 = lVar16 + -1) {
    *ppTVar21 = *out;
    out = out + 1;
    ppTVar21 = ppTVar21 + 1;
  }
  local_148 = this->uniformVarMap;
  ppTVar21 = local_148;
  for (lVar16 = 0xe; lVar16 != 0; lVar16 = lVar16 + -1) {
    *ppTVar21 = *uniform;
    uniform = uniform + 1;
    ppTVar21 = ppTVar21 + 1;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (TRange *)0x0;
  local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (TRange *)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar16 = 0;
  local_1e0 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pTVar2 = local_148[lVar16];
    local_140 = lVar16;
    if (pTVar2 != (TVarLiveMap *)0x0) {
      p_Var12 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_138 = &(pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
      if (p_Var12 != local_138) {
        do {
          local_e0 = GetThreadPoolAllocator();
          local_d8 = local_c8;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&local_e0,p_Var12[1]._M_parent,
                              (long)&(p_Var12[1]._M_parent)->_M_color +
                              (long)&(p_Var12[1]._M_left)->_M_color);
          local_b8 = *(undefined4 *)&p_Var12[2]._M_parent;
          uStack_b4 = *(undefined4 *)((long)&p_Var12[2]._M_parent + 4);
          uStack_b0 = *(undefined4 *)&p_Var12[2]._M_left;
          uStack_ac = *(undefined4 *)((long)&p_Var12[2]._M_left + 4);
          p_Var5 = p_Var12[2]._M_left;
          local_a8 = *(undefined4 *)&p_Var12[2]._M_right;
          uStack_a4 = *(undefined4 *)((long)&p_Var12[2]._M_right + 4);
          _Stack_a0 = p_Var12[3]._M_color;
          uStack_9c = *(undefined4 *)&p_Var12[3].field_0x4;
          local_98 = *(undefined4 *)&p_Var12[3]._M_parent;
          uStack_94 = *(undefined4 *)((long)&p_Var12[3]._M_parent + 4);
          uStack_90 = *(undefined4 *)&p_Var12[3]._M_left;
          uStack_8c = *(undefined4 *)((long)&p_Var12[3]._M_left + 4);
          lVar16 = (**(code **)(*(long *)p_Var5 + 0x108))(p_Var5);
          uVar18 = *(uint *)(lVar16 + 0x1c) & 0xfff;
          lVar16 = (**(code **)(*(long *)p_Var5 + 0x1a0))(p_Var5);
          local_130._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&local_130,*(long *)(lVar16 + 8),
                              *(long *)(lVar16 + 0x10) + *(long *)(lVar16 + 8));
          if (uVar18 == 0xfff) {
LAB_003f77fa:
            iVar7 = (**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0x100))();
            if (iVar7 == 0x10) {
              pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 400))();
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(pbVar11,0,5,"anon@");
              if (iVar7 == 0) {
                plVar10 = (long *)(**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0xf0))();
                cVar6 = (**(code **)(*plVar10 + 0x128))(plVar10);
                if (cVar6 == '\0') {
                  __assert_fail("isStruct()",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
                }
                lVar16 = plVar10[0xd];
                if (*(long *)(lVar16 + 0x10) != *(long *)(lVar16 + 8)) {
                  lVar22 = 0;
                  uVar19 = 0;
                  do {
                    lVar13 = (**(code **)(**(long **)(*(long *)(lVar16 + 8) + lVar22) + 0x30))();
                    local_108._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
                    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                    std::__cxx11::
                    basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                         *)&local_108,*(long *)(lVar13 + 8),
                                        *(long *)(lVar13 + 0x10) + *(long *)(lVar13 + 8));
                    iVar14 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                             ::find(&local_60,&local_108);
                    if ((_Rb_tree_header *)iVar14._M_node == &local_60._M_impl.super__Rb_tree_header
                       ) {
                      plVar10 = (long *)(**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0xf0))
                                                  ();
                      pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)(**(code **)(*plVar10 + 0x28))(plVar10);
                      pmVar15 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                              *)&local_60,&local_108);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      _M_assign(pmVar15,pbVar11);
                    }
                    else {
                      pmVar15 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                              *)&local_60,&local_108);
                      plVar10 = (long *)(**(code **)(*(long *)CONCAT44(uStack_ac,uStack_b0) + 0xf0))
                                                  ();
                      pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)(**(code **)(*plVar10 + 0x28))(plVar10);
                      iVar7 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::compare(pmVar15,pbVar11);
                      if (iVar7 != 0) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        *)local_1b0,"Invalid block member name: ",&local_108);
                        TInfoSinkBase::message
                                  (&local_1e0->infoSink->info,EPrefixInternalError,
                                   (char *)local_1b0._8_8_);
                        *hadError = true;
                        break;
                      }
                    }
                    uVar19 = uVar19 + 1;
                    lVar22 = lVar22 + 0x20;
                  } while (uVar19 < (ulong)(*(long *)(lVar16 + 0x10) - *(long *)(lVar16 + 8) >> 5));
                }
              }
            }
            iVar7 = (uint)*hadError + (uint)*hadError * 4;
          }
          else {
            type = (TType *)(**(code **)(*(long *)p_Var5 + 0xf0))(p_Var5);
            iVar7 = TIntermediate::computeTypeUniformLocationSize(type);
            local_1d8.last = iVar7 + uVar18 + -1;
            local_1e1 = false;
            local_1d8.start = uVar18;
            local_88._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)&local_88,local_130._M_dataplus._M_p,
                                local_130._M_dataplus._M_p + local_130._M_string_length);
            uVar18 = checkLocationOverlap
                               (local_1e0,&local_1d8,&local_1c8,&local_88,&local_168,&local_1e1);
            if (uVar18 == 0xffffffff) {
              if (local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<glslang::TRange,std::allocator<glslang::TRange>>::
                _M_realloc_insert<glslang::TRange_const&>
                          ((vector<glslang::TRange,std::allocator<glslang::TRange>> *)&local_1c8,
                           (iterator)
                           local_1c8.
                           super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_1d8);
              }
              else {
                TVar4.last = local_1d8.last;
                TVar4.start = local_1d8.start;
                *local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                 _M_impl.super__Vector_impl_data._M_finish = TVar4;
                local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::push_back(&local_168,&local_130);
LAB_003f7689:
              iVar7 = 0;
              bVar3 = true;
            }
            else {
              if ((int)uVar18 < 0) goto LAB_003f7689;
              __len = 1;
              if (local_1e1 == true) {
                if (9 < uVar18) {
                  uVar8 = uVar18;
                  uVar9 = 4;
                  do {
                    __len = uVar9;
                    if (uVar8 < 100) {
                      __len = __len - 2;
                      goto LAB_003f76a1;
                    }
                    if (uVar8 < 1000) {
                      __len = __len - 1;
                      goto LAB_003f76a1;
                    }
                    if (uVar8 < 10000) goto LAB_003f76a1;
                    bVar3 = 99999 < uVar8;
                    uVar8 = uVar8 / 10000;
                    uVar9 = __len + 4;
                  } while (bVar3);
                  __len = __len + 1;
                }
LAB_003f76a1:
                local_188[0] = local_178;
                std::__cxx11::string::_M_construct((ulong)local_188,(char)__len);
                std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_188[0],__len,uVar18);
                pcVar17 = "Uniform location should be equal for same uniforms: ";
              }
              else {
                if (9 < uVar18) {
                  uVar8 = 4;
                  uVar9 = uVar18;
                  do {
                    __len = uVar8;
                    if (uVar9 < 100) {
                      __len = __len - 2;
                      goto LAB_003f76e9;
                    }
                    if (uVar9 < 1000) {
                      __len = __len - 1;
                      goto LAB_003f76e9;
                    }
                    if (uVar9 < 10000) goto LAB_003f76e9;
                    bVar3 = 99999 < uVar9;
                    uVar8 = __len + 4;
                    uVar9 = uVar9 / 10000;
                  } while (bVar3);
                  __len = __len + 1;
                }
LAB_003f76e9:
                local_188[0] = local_178;
                std::__cxx11::string::_M_construct((ulong)local_188,(char)__len);
                std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_188[0],__len,uVar18);
                pcVar17 = "Uniform location overlaps across stages: ";
              }
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_188,0,(char *)0x0,(ulong)pcVar17);
              pTVar1 = (TPoolAllocator *)(plVar10 + 2);
              if ((TPoolAllocator *)*plVar10 == pTVar1) {
                local_1b0._16_8_ = pTVar1->pageSize;
                aStack_198._M_allocated_capacity = plVar10[3];
                local_1b0._0_8_ = (TPoolAllocator *)(local_1b0 + 0x10);
              }
              else {
                local_1b0._16_8_ = pTVar1->pageSize;
                local_1b0._0_8_ = (TPoolAllocator *)*plVar10;
              }
              __s = local_1b0._0_8_;
              local_1b0._8_8_ = plVar10[1];
              *plVar10 = (long)pTVar1;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              local_1d0.allocator = GetThreadPoolAllocator();
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         &local_108,(char *)__s,&local_1d0);
              if ((TPoolAllocator *)local_1b0._0_8_ != (TPoolAllocator *)(local_1b0 + 0x10)) {
                operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
              }
              if (local_188[0] != local_178) {
                operator_delete(local_188[0],local_178[0] + 1);
              }
              TInfoSinkBase::message
                        (&local_1e0->infoSink->info,EPrefixInternalError,local_108._M_dataplus._M_p)
              ;
              *hadError = true;
              iVar7 = 5;
              bVar3 = false;
            }
            if (bVar3) goto LAB_003f77fa;
          }
        } while ((iVar7 == 0) &&
                (p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12), p_Var12 != local_138));
      }
    }
    lVar16 = local_140 + 1;
    if (lVar16 == 0xe) {
      if (local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1c8.super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c8.
                        super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1c8.
                              super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.
                              super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
      return;
    }
  } while( true );
}

Assistant:

TSymbolValidater(TIoMapResolver& r, TInfoSink& i, TVarLiveMap* in[EShLangCount], TVarLiveMap* out[EShLangCount],
                     TVarLiveMap* uniform[EShLangCount], bool& hadError, EProfile profile, int version)
        : resolver(r)
        , infoSink(i)
        , hadError(hadError)
        , profile(profile)
        , version(version)
    {
        memcpy(inVarMaps, in, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(outVarMaps, out, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(uniformVarMap, uniform, EShLangCount * (sizeof(TVarLiveMap*)));

        std::map<TString, TString> anonymousMemberMap;
        std::vector<TRange> usedUniformLocation;
        std::vector<TString> usedUniformName;
        usedUniformLocation.clear();
        usedUniformName.clear();
        for (int i = 0; i < EShLangCount; i++) {
            if (uniformVarMap[i]) {
                for (auto uniformVar : *uniformVarMap[i])
                {
                    TIntermSymbol* pSymbol = uniformVar.second.symbol;
                    TQualifier qualifier = uniformVar.second.symbol->getQualifier();
                    TString symbolName = pSymbol->getAccessName();

                    // All the uniform needs multi-stage location check (block/default)
                    int uniformLocation = qualifier.layoutLocation;

                    if (uniformLocation != TQualifier::layoutLocationEnd) {
                        // Total size of current uniform, could be block, struct or other types.
                        int size = TIntermediate::computeTypeUniformLocationSize(pSymbol->getType());

                        TRange locationRange(uniformLocation, uniformLocation + size - 1);

                        // Combine location and component ranges
                        int overlapLocation = -1;
                        bool diffLocation = false;

                        // Check for collisions, except for vertex inputs on desktop targeting OpenGL
                        overlapLocation = checkLocationOverlap(locationRange, usedUniformLocation, symbolName, usedUniformName, diffLocation);

                        // Overlap locations of uniforms, regardless of components (multi stages)
                        if (overlapLocation == -1) {
                            usedUniformLocation.push_back(locationRange);
                            usedUniformName.push_back(symbolName);
                        }
                        else if (overlapLocation >= 0) {
                            if (diffLocation == true) {
                                TString err = ("Uniform location should be equal for same uniforms: " +std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                            else {
                                TString err = ("Uniform location overlaps across stages: " + std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                        }
                    }

                    if ((uniformVar.second.symbol->getBasicType() == EbtBlock) &&
                        IsAnonymous(uniformVar.second.symbol->getName()))
                    {
                        auto blockType = uniformVar.second.symbol->getType().getStruct();
                        for (size_t memberIdx = 0; memberIdx < blockType->size(); ++memberIdx) {
                            auto memberName = (*blockType)[memberIdx].type->getFieldName();
                            if (anonymousMemberMap.find(memberName) != anonymousMemberMap.end())
                            {
                                if (anonymousMemberMap[memberName] != uniformVar.second.symbol->getType().getTypeName())
                                {
                                    TString err = "Invalid block member name: " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                            else
                            {
                                anonymousMemberMap[memberName] = uniformVar.second.symbol->getType().getTypeName();
                            }
                        }
                    }
                    if (hadError)
                        break;
                }
            }
        }
    }